

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat06.c
# Opt level: O2

int th06_open(thdat_t *thdat,thtk_error_t **error)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  off_t oVar5;
  thtk_io_t *output;
  uchar *map;
  size_t sVar6;
  thdat_entry_t *ptVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  thdat_entry_t *ptVar11;
  uint i;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  char magic [4];
  th07_header_t header;
  
  sVar4 = thtk_io_read(thdat->stream,magic,4,error);
  if (sVar4 != 4) {
    return 0;
  }
  if (magic == (char  [4])0x33474250) {
    bitstream_init((bitstream *)&header,thdat->stream);
    uVar2 = th06_read_uint32((bitstream *)&header);
    uVar3 = th06_read_uint32((bitstream *)&header);
    thdat->offset = uVar3;
    uVar12 = 0;
    oVar5 = thtk_io_seek(thdat->stream,(ulong)uVar3,0,error);
    if (oVar5 == -1) {
      return 0;
    }
    bitstream_init((bitstream *)&header,thdat->stream);
    for (; uVar12 != uVar2; uVar12 = uVar12 + 1) {
      sVar6 = thdat->entry_count + 1;
      thdat->entry_count = sVar6;
      ptVar7 = (thdat_entry_t *)realloc(thdat->entries,sVar6 * 0x120);
      thdat->entries = ptVar7;
      sVar6 = thdat->entry_count;
      thdat_entry_init(ptVar7 + (sVar6 - 1));
      th06_read_uint32((bitstream *)&header);
      th06_read_uint32((bitstream *)&header);
      uVar3 = th06_read_uint32((bitstream *)&header);
      ptVar7[sVar6 - 1].extra = uVar3;
      uVar3 = th06_read_uint32((bitstream *)&header);
      ptVar7[sVar6 - 1].offset = (ulong)uVar3;
      uVar3 = th06_read_uint32((bitstream *)&header);
      ptVar7[sVar6 - 1].size = (ulong)uVar3;
      for (lVar10 = -0x120; (int)lVar10 != -0x21; lVar10 = lVar10 + 1) {
        uVar3 = bitstream_read((bitstream *)&header,8);
        ptVar7[sVar6].name[lVar10] = (char)uVar3;
        if ((char)uVar3 == '\0') break;
      }
    }
  }
  else {
    if (magic != (char  [4])0x34474250) {
      thtk_error_func_new(error,"th06_open","magic string not recognized");
      return 0;
    }
    sVar4 = thtk_io_read(thdat->stream,&header,0xc,error);
    if (sVar4 != 0xc) {
      return 0;
    }
    oVar5 = thtk_io_seek(thdat->stream,0,2,error);
    if (oVar5 == -1) {
      return 0;
    }
    oVar5 = thtk_io_seek(thdat->stream,(ulong)header.offset,0,error);
    if (oVar5 == -1) {
      return 0;
    }
    output = thtk_io_open_growing_memory(error);
    sVar4 = th_unlzss(thdat->stream,output,(ulong)header.size,error);
    if (sVar4 == -1) {
      return 0;
    }
    uVar13 = 0;
    map = thtk_io_map(output,0,(ulong)header.size,error);
    if (map == (uchar *)0x0) {
      return 0;
    }
    for (; uVar13 < header.count; uVar13 = uVar13 + 1) {
      sVar6 = thdat->entry_count + 1;
      thdat->entry_count = sVar6;
      ptVar7 = (thdat_entry_t *)realloc(thdat->entries,sVar6 * 0x120);
      thdat->entries = ptVar7;
      sVar6 = thdat->entry_count;
      ptVar11 = ptVar7 + (sVar6 - 1);
      thdat_entry_init(ptVar11);
      strcpy(ptVar11->name,(char *)map);
      sVar8 = strlen(ptVar11->name);
      ptVar7[sVar6 - 1].offset = (ulong)*(uint *)(map + sVar8 + 1);
      ptVar7[sVar6 - 1].size = (ulong)*(uint *)(map + sVar8 + 5);
      ptVar7[sVar6 - 1].extra = *(uint32_t *)(map + sVar8 + 9);
      map = map + sVar8 + 0xd;
    }
    thtk_io_unmap(output,map);
    thtk_io_close(output);
  }
  iVar14 = 0;
  oVar5 = thtk_io_seek(thdat->stream,0,2,error);
  if (oVar5 != -1) {
    uVar1 = thdat->entry_count;
    iVar14 = 1;
    if (uVar1 != 0) {
      ptVar7 = (thdat_entry_t *)0x0;
      for (uVar13 = 0; uVar9 = (ulong)uVar13, uVar9 < uVar1; uVar13 = uVar13 + 1) {
        ptVar11 = thdat->entries;
        if (ptVar7 != (thdat_entry_t *)0x0) {
          ptVar7->zsize = ptVar11[uVar9].offset - ptVar7->offset;
        }
        ptVar7 = ptVar11 + uVar9;
      }
      ptVar7->zsize = oVar5 - ptVar7->offset;
    }
  }
  return iVar14;
}

Assistant:

static int
th06_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    char magic[4];

    if (thtk_io_read(thdat->stream, magic, 4, error) != 4)
        return 0;

    if (strncmp(magic, "PBG3", 4) == 0) {
        struct bitstream b;
        bitstream_init(&b, thdat->stream);
        uint32_t entry_count = th06_read_uint32(&b);
        thdat->offset = th06_read_uint32(&b);

        if (thtk_io_seek(thdat->stream, thdat->offset, SEEK_SET, error) == -1)
            return 0;

        bitstream_init(&b, thdat->stream);
        for (unsigned int i = 0; i < entry_count; ++i) {
            thdat_entry_t* entry;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            th06_read_uint32(&b);
            th06_read_uint32(&b);
            entry->extra = th06_read_uint32(&b);
            entry->offset = th06_read_uint32(&b);
            entry->size = th06_read_uint32(&b);
            th06_read_string(&b, 255, entry->name);
        }
    } else if (strncmp(magic, "PBG4", 4) == 0) {
        th07_header_t header;

        if (thtk_io_read(thdat->stream, &header, sizeof(header), error) != sizeof(header))
            return 0;

        off_t end = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
        if (end == -1)
            return 0;

        if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
            return 0;

        thtk_io_t* entry_headers = thtk_io_open_growing_memory(error);
        /* XXX: I can't use header.size for this. */
        if (th_unlzss(thdat->stream, entry_headers, header.size, error) == -1)
            return 0;

        const uint32_t* ptr = (uint32_t*)thtk_io_map(entry_headers, 0, header.size, error);
        if (!ptr)
            return 0;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = NULL;
            ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
            thdat_entry_init(entry);
            strcpy(entry->name, (char*)ptr);
            ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
            entry->offset = *ptr++;
            entry->size = *ptr++;
            entry->extra = *ptr++;
        }

        thtk_io_unmap(entry_headers, (unsigned char*)ptr);
        thtk_io_close(entry_headers);
    } else {
        thtk_error_new(error, "magic string not recognized");
        return 0;
    }

    off_t end_offset = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (end_offset == -1)
        return 0;

    if (thdat->entry_count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < thdat->entry_count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = end_offset - prev->offset;
    }

    return 1;
}